

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O2

bool ZXing::OneD::
     FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
               (PairMap *all,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               Pairs *stack)

{
  pointer *ppPVar1;
  value_type *pvVar2;
  pointer pPVar3;
  pointer pPVar4;
  int iVar5;
  const_iterator cVar6;
  pointer pPVar7;
  uint uVar8;
  value_type *__x;
  bool bVar9;
  bool bVar10;
  
  if (begin._M_current == end._M_current) {
    pPVar4 = (stack->
             super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = 0;
    pPVar3 = (stack->
             super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (pPVar7 = pPVar3; pPVar7 != pPVar4; pPVar7 = pPVar7 + 1) {
      iVar5 = iVar5 + (pPVar7->left).checksum + (pPVar7->right).checksum;
    }
    bVar10 = (pPVar3->left).value ==
             ((int)(((long)pPVar4 - (long)pPVar3) / 0x24) * 2 - (uint)(pPVar4[-1].right.value == -1)
             ) * 0xd3 + iVar5 % 0xd3 + -0x34c;
  }
  else {
    cVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
            ::find(&all->_M_t,begin._M_current);
    uVar8 = 0;
    if ((_Rb_tree_header *)cVar6._M_node == &(all->_M_t)._M_impl.super__Rb_tree_header) {
      bVar10 = false;
    }
    else {
      __x = (value_type *)cVar6._M_node[1]._M_parent;
      pvVar2 = (value_type *)cVar6._M_node[1]._M_left;
      for (; bVar9 = __x != pvVar2, bVar10 = uVar8 < 2 && bVar9, uVar8 < 2 && bVar9;
          uVar8 = uVar8 + 1) {
        if ((__x->right).value != -1 || begin._M_current + 1 == end._M_current) {
          std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
          push_back(stack,__x);
          bVar9 = FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                            (all,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  )(begin._M_current + 1),end,stack);
          if (bVar9) {
            return bVar10;
          }
          ppPVar1 = &(stack->
                     super__Vector_base<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + -1;
        }
        __x = __x + 1;
      }
    }
  }
  return bVar10;
}

Assistant:

static bool FindValidSequence(const PairMap& all, ITER begin, ITER end, Pairs& stack)
{
	if (begin == end)
		return ChecksumIsValid(stack);

	if (auto ppairs = all.find(*begin); ppairs != all.end()) {
		// only try the N most common pairs, this means the absolute maximum number of ChecksumIsValid() evaluations
		// is N^11 (11 is the maximum sequence length).
		constexpr int N = 2;
		// TODO c++20 ranges::views::take()
		auto& pairs = ppairs->second;
		int n = 0;
		for (auto p = pairs.begin(), pend = pairs.end(); p != pend && n < N; ++p, ++n) {
			// skip p if it is a half-pair but not the last one in the sequence
			if (!p->right && std::next(begin) != end)
				continue;
			// to lower the chance of a misread, one can require each pair to have been seen at least N times.
			// e.g: if (p.count < 2) break;
			stack.push_back(*p);
			if (FindValidSequence(all, std::next(begin), end, stack))
				return true;
			stack.pop_back();
		}
	}

	return false;
}